

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXProperties.h
# Opt level: O0

float Assimp::FBX::PropertyGet<float>(PropertyTable *in,string *name,float *defaultValue)

{
  Property *this;
  TypedProperty<float> *this_00;
  float *pfVar1;
  TypedProperty<float> *tprop;
  Property *prop;
  float *defaultValue_local;
  string *name_local;
  PropertyTable *in_local;
  
  this = PropertyTable::Get(in,name);
  if (this == (Property *)0x0) {
    in_local._4_4_ = *defaultValue;
  }
  else {
    this_00 = Property::As<Assimp::FBX::TypedProperty<float>>(this);
    if (this_00 == (TypedProperty<float> *)0x0) {
      in_local._4_4_ = *defaultValue;
    }
    else {
      pfVar1 = TypedProperty<float>::Value(this_00);
      in_local._4_4_ = *pfVar1;
    }
  }
  return in_local._4_4_;
}

Assistant:

inline 
T PropertyGet(const PropertyTable& in, const std::string& name, const T& defaultValue) {
    const Property* const prop = in.Get(name);
    if( nullptr == prop) {
        return defaultValue;
    }

    // strong typing, no need to be lenient
    const TypedProperty<T>* const tprop = prop->As< TypedProperty<T> >();
    if( nullptr == tprop) {
        return defaultValue;
    }

    return tprop->Value();
}